

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

ActivationReLU * __thiscall
CoreML::Specification::ActivationReLU::New(ActivationReLU *this,Arena *arena)

{
  ActivationReLU *this_00;
  
  this_00 = (ActivationReLU *)operator_new(0x18);
  ActivationReLU(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationReLU>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationReLU* ActivationReLU::New(::google::protobuf::Arena* arena) const {
  ActivationReLU* n = new ActivationReLU;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}